

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsMan.c
# Opt level: O2

void Mfs_ManStop(Mfs_Man_t *p)

{
  if (p->pPars->fVerbose != 0) {
    Mfs_ManPrint(p);
  }
  if (p->vTruth != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vTruth);
  }
  if (p->pManDec != (Bdc_Man_t *)0x0) {
    Bdc_ManFree(p->pManDec);
  }
  if (p->pCare != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pCare);
  }
  if ((Vec_Vec_t *)p->vSuppsInv != (Vec_Vec_t *)0x0) {
    Vec_VecFree((Vec_Vec_t *)p->vSuppsInv);
  }
  if (p->vProbs != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vProbs);
  }
  Mfs_ManClean(p);
  Int_ManFree(p->pMan);
  Vec_IntFree(p->vMem);
  Vec_VecFree(p->vLevels);
  Vec_PtrFree(p->vMfsFanins);
  Vec_IntFree(p->vProjVarsCnf);
  Vec_IntFree(p->vProjVarsSat);
  Vec_IntFree(p->vDivLits);
  Vec_PtrFree(p->vDivCexes);
  free(p);
  return;
}

Assistant:

void Mfs_ManStop( Mfs_Man_t * p )
{
    if ( p->pPars->fVerbose )
        Mfs_ManPrint( p );
    if ( p->vTruth )
        Vec_IntFree( p->vTruth );
    if ( p->pManDec )
        Bdc_ManFree( p->pManDec );
    if ( p->pCare )
        Aig_ManStop( p->pCare );
    if ( p->vSuppsInv )
        Vec_VecFree( (Vec_Vec_t *)p->vSuppsInv );
    if ( p->vProbs )
        Vec_IntFree( p->vProbs );
    Mfs_ManClean( p );
    Int_ManFree( p->pMan );
    Vec_IntFree( p->vMem );
    Vec_VecFree( p->vLevels );
    Vec_PtrFree( p->vMfsFanins );
    Vec_IntFree( p->vProjVarsCnf );
    Vec_IntFree( p->vProjVarsSat );
    Vec_IntFree( p->vDivLits );
    Vec_PtrFree( p->vDivCexes );
    ABC_FREE( p );
}